

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdSetPsbtTxInUtxo(void *handle,void *psbt_handle,char *txid,uint32_t vout,int64_t amount,
                      char *locking_script,char *full_tx_hex)

{
  Psbt *pPVar1;
  bool bVar2;
  CfdException *pCVar3;
  TxOut txout;
  AbstractTxOutReference local_148;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> pubkeys;
  OutPoint outpoint;
  Script redeem_script;
  Script script;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&txout,"PsbtHandle",(allocator *)&local_148);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fd756;
    txout.super_AbstractTxOut.value_.amount_._0_4_ = 0x323;
    txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_7cb701;
    cfd::core::logger::warn<>((CfdSourceLocation *)&txout,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&txout,"Failed to parameter. txid is null or empty.",
               (allocator *)&local_148);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&txout);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fd756;
    txout.super_AbstractTxOut.value_.amount_._0_4_ = 0x329;
    txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_7cb701;
    cfd::core::logger::warn<>((CfdSourceLocation *)&txout,"psbt is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&txout,"Failed to handle statement. psbt is null.",(allocator *)&local_148)
    ;
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&txout);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_148,txid,(allocator *)&redeem_script);
  cfd::core::Txid::Txid((Txid *)&txout,(string *)&local_148);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&txout,vout);
  cfd::core::Txid::~Txid((Txid *)&txout);
  std::__cxx11::string::~string((string *)&local_148);
  cfd::Psbt::GetTxInRedeemScript
            (&redeem_script,*(Psbt **)((long)psbt_handle + 0x18),&outpoint,true,(bool *)0x0);
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = cfd::capi::IsEmptyString(full_tx_hex);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_148,full_tx_hex,(allocator *)&script);
    cfd::core::Transaction::Transaction((Transaction *)&txout,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    cfd::Psbt::SetTxInUtxo
              (*(Psbt **)((long)psbt_handle + 0x18),&outpoint,(Transaction *)&txout,&redeem_script,
               &key_list);
    cfd::core::Transaction::~Transaction((Transaction *)&txout);
    goto LAB_0038481b;
  }
  bVar2 = cfd::capi::IsEmptyString(locking_script);
  if (bVar2) goto LAB_0038481b;
  std::__cxx11::string::string((string *)&txout,locking_script,(allocator *)&local_148);
  cfd::core::Script::Script(&script,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  cfd::core::Amount::Amount((Amount *)&local_148,amount);
  cfd::core::TxOut::TxOut(&txout,(Amount *)&local_148,&script);
  cfd::Psbt::GetTxInKeyDataList(&pubkeys,*(Psbt **)((long)psbt_handle + 0x18),&outpoint);
  bVar2 = cfd::core::Script::IsWitnessProgram(&script);
  if (bVar2) {
LAB_0038475f:
    pPVar1 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_148,&txout);
    cfd::Psbt::SetTxInUtxo(pPVar1,&outpoint,(TxOutReference *)&local_148,&redeem_script,&key_list);
  }
  else {
    bVar2 = cfd::core::Script::IsEmpty(&redeem_script);
    if ((!bVar2) ||
       (pubkeys.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pubkeys.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
        super__Vector_impl_data._M_finish)) goto LAB_0038475f;
    pPVar1 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_148,&txout);
    cfd::Psbt::SetTxInWitnessUtxoDirect(pPVar1,&outpoint,(TxOutReference *)&local_148);
  }
  cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&local_148);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&pubkeys);
  cfd::core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
  cfd::core::Script::~Script(&script);
LAB_0038481b:
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  cfd::core::Script::~Script(&redeem_script);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  return 0;
}

Assistant:

int CfdSetPsbtTxInUtxo(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* locking_script, const char* full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);
    auto redeem_script = psbt_obj->psbt->GetTxInRedeemScript(outpoint, true);
    std::vector<KeyData> key_list;
    if (!IsEmptyString(full_tx_hex)) {
      Transaction tx(full_tx_hex);
      psbt_obj->psbt->SetTxInUtxo(outpoint, tx, redeem_script, key_list);
    } else if (!IsEmptyString(locking_script)) {
      Script script(locking_script);
      TxOut txout(Amount(amount), script);
      auto pubkeys = psbt_obj->psbt->GetTxInKeyDataList(outpoint);
      if (script.IsWitnessProgram() || (!redeem_script.IsEmpty()) ||
          (!pubkeys.empty())) {
        psbt_obj->psbt->SetTxInUtxo(
            outpoint, TxOutReference(txout), redeem_script, key_list);
      } else {  // on P2SH-segwit
        psbt_obj->psbt->SetTxInWitnessUtxoDirect(
            outpoint, TxOutReference(txout));
      }
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}